

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O2

ArgIface * __thiscall Args::Arg::findArgument(Arg *this,String *name)

{
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = details::isArgument(name);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
    _Var2 = std::operator==(&local_40,&this->m_name);
    std::__cxx11::string::~string((string *)&local_40);
    if (_Var2) {
      return &this->super_ArgIface;
    }
  }
  bVar1 = details::isFlag(name);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
    _Var2 = std::operator==(&local_40,&this->m_flag);
    std::__cxx11::string::~string((string *)&local_40);
    if (!_Var2) {
      this = (Arg *)0x0;
    }
  }
  else {
    this = (Arg *)0x0;
  }
  return &this->super_ArgIface;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		if( details::isArgument( name ) && name.substr( 2 ) == m_name )
			return this;
		else if( details::isFlag( name ) && name.substr( 1 ) == m_flag )
			return this;
		else
			return nullptr;
	}